

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
csv::get_col_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,csv *this,string_view filename,CSVFormat *format)

{
  CSVGuessResult CVar1;
  CSVFormat *pCVar2;
  CSVFormat *this_00;
  string_view head_00;
  string_view filename_00;
  string head;
  _Vector_base<char,_std::allocator<char>_> local_b0;
  string local_98;
  CSVFormat local_78;
  
  this_00 = (CSVFormat *)filename._M_str;
  pCVar2 = this_00;
  internals::get_csv_head_abi_cxx11_(&local_98,(internals *)this,filename);
  if (1 < (ulong)((long)(this_00->possible_delimiters).
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this_00->possible_delimiters).
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_b0,
               (vector<char,_std::allocator<char>_> *)this_00);
    filename_00._M_str = (char *)&local_b0;
    filename_00._M_len = filename._M_len;
    CVar1 = guess_format(this,filename_00,&pCVar2->possible_delimiters);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_b0);
    pCVar2 = CSVFormat::delimiter(this_00,CVar1.delim);
    CSVFormat::header_row(pCVar2,CVar1.header_row);
  }
  CSVFormat::CSVFormat(&local_78,this_00);
  head_00._M_str = (char *)&local_78;
  head_00._M_len = (size_t)local_98._M_dataplus._M_p;
  internals::_get_col_names_abi_cxx11_(__return_storage_ptr__,(internals *)this_00,head_00,format);
  CSVFormat::~CSVFormat(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::vector<std::string> get_col_names(csv::string_view filename, CSVFormat format) {
        auto head = internals::get_csv_head(filename);

        /** Guess delimiter and header row */
        if (format.guess_delim()) {
            auto guess_result = guess_format(filename, format.get_possible_delims());
            format.delimiter(guess_result.delim).header_row(guess_result.header_row);
        }

        return internals::_get_col_names(head, format);
    }